

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O1

void __thiscall
flatbuffers::SymbolTable<flatbuffers::Value>::~SymbolTable(SymbolTable<flatbuffers::Value> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *pVVar2;
  pointer pcVar3;
  pointer ppVVar4;
  
  ppVVar4 = (this->vec).
            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 !=
      (this->vec).super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pVVar2 = *ppVVar4;
      if (pVVar2 != (Value *)0x0) {
        pcVar3 = (pVVar2->constant)._M_dataplus._M_p;
        paVar1 = &(pVVar2->constant).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pVVar2,0x48);
      }
      ppVVar4 = ppVVar4 + 1;
    } while (ppVVar4 !=
             (this->vec).
             super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  ppVVar4 = (this->vec).
            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 != (pointer)0x0) {
    operator_delete(ppVVar4,(long)(this->vec).
                                  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar4
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               *)this);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }